

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Matches * __thiscall
Catch::TestSpec::matchesByFilter
          (Matches *__return_storage_ptr__,TestSpec *this,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,IConfig *config)

{
  pointer pTVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  TestCase *test;
  pointer testCase;
  pointer this_00;
  pointer this_01;
  vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> currentMatches;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range2;
  vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> local_98;
  pointer local_80;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_78;
  pointer local_70;
  string local_68;
  vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> local_48;
  
  local_78 = testCases;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  vector(__return_storage_ptr__,
         ((long)(this->m_filters).
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_filters).
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
         (allocator_type *)&local_68);
  this_00 = (this->m_filters).
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->m_filters).
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_80) {
    this_01 = (__return_storage_ptr__->
              super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
              )._M_impl.super__Vector_impl_data._M_start;
    do {
      local_98.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (TestCase **)0x0;
      local_98.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (TestCase **)0x0;
      pTVar1 = (local_78->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (testCase = (local_78->
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl
                      .super__Vector_impl_data._M_start; testCase != pTVar1; testCase = testCase + 1
          ) {
        if (((testCase->super_TestCaseInfo).properties & Throws) == None) {
LAB_0013f5f0:
          bVar3 = Filter::matches(this_00,&testCase->super_TestCaseInfo);
          if (bVar3) {
            local_70 = testCase;
            if (local_98.
                super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>>::
              _M_realloc_insert<Catch::TestCase_const*>
                        ((vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>> *)
                         &local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_70);
            }
            else {
              *local_98.
               super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = testCase;
              local_98.
              super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        else {
          iVar4 = (*(config->super_NonCopyable)._vptr_NonCopyable[2])(config);
          if ((char)iVar4 != '\0') goto LAB_0013f5f0;
        }
      }
      Filter::name_abi_cxx11_(&local_68,this_00);
      clara::std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::vector
                (&local_48,&local_98);
      if (local_98.
          super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_68);
      pvVar2 = (this_01->tests).
               super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this_01->tests).
      super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (this_01->tests).
      super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_48.
           super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (this_01->tests).
      super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_48.
           super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
        if (local_48.
            super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
      this_01 = this_01 + 1;
    } while (this_00 != local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

TestSpec::Matches TestSpec::matchesByFilter( std::vector<TestCase> const& testCases, IConfig const& config ) const
    {
        Matches matches( m_filters.size() );
        std::transform( m_filters.begin(), m_filters.end(), matches.begin(), [&]( Filter const& filter ){
            std::vector<TestCase const*> currentMatches;
            for( auto const& test : testCases )
                if( isThrowSafe( test, config ) && filter.matches( test ) )
                    currentMatches.emplace_back( &test );
            return FilterMatch{ filter.name(), currentMatches };
        } );
        return matches;
    }